

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612.cpp
# Opt level: O0

ssize_t __thiscall LibGens::Ym2612::write(Ym2612 *this,int __fd,void *__buf,size_t __n)

{
  byte data;
  uint uVar1;
  int reg_num;
  uint8_t data_local;
  uint address_local;
  Ym2612 *this_local;
  
  data = (byte)__buf;
  switch(__fd & 3) {
  case 0:
    (this->d->state).OPNAadr = (uint)data;
    break;
  case 1:
    if ((this->d->state).OPNAadr == 0x2a) {
      (this->d->state).DACdata = (data - 0x80) * 0x80;
      this_local._4_4_ = 0;
      goto LAB_001e5001;
    }
    uVar1 = (this->d->state).OPNAadr & 0xf0;
    if (uVar1 < 0x30) {
      (this->d->state).REG[0][(this->d->state).OPNAadr] = data;
      Ym2612Private::YM_SET(this->d,(this->d->state).OPNAadr,data);
    }
    else {
      if ((this->d->state).REG[0][(this->d->state).OPNAadr] == data) {
        this_local._4_4_ = 2;
        goto LAB_001e5001;
      }
      (this->d->state).REG[0][(this->d->state).OPNAadr] = data;
      if (uVar1 < 0xa0) {
        Ym2612Private::SLOT_SET(this->d,(this->d->state).OPNAadr,data);
      }
      else {
        Ym2612Private::CHANNEL_SET(this->d,(this->d->state).OPNAadr,data);
      }
    }
    break;
  case 2:
    (this->d->state).OPNBadr = (uint)data;
    break;
  case 3:
    uVar1 = (this->d->state).OPNBadr & 0xf0;
    if (uVar1 < 0x30) {
      this_local._4_4_ = 1;
      goto LAB_001e5001;
    }
    if ((this->d->state).REG[1][(this->d->state).OPNBadr] == data) {
      this_local._4_4_ = 2;
      goto LAB_001e5001;
    }
    (this->d->state).REG[1][(this->d->state).OPNBadr] = data;
    if (uVar1 < 0xa0) {
      Ym2612Private::SLOT_SET(this->d,(this->d->state).OPNBadr + 0x100,data);
    }
    else {
      Ym2612Private::CHANNEL_SET(this->d,(this->d->state).OPNBadr + 0x100,data);
    }
  }
  this_local._4_4_ = 0;
LAB_001e5001:
  return (ulong)this_local._4_4_;
}

Assistant:

int Ym2612::write(unsigned int address, uint8_t data)
{
	/**
	 * Possible addresses:
	 * - 0: Bank 0 register number.
	 * - 1: Bank 0 data.
	 * - 2: Bank 1 register number.
	 * - 3: Bank 1 data.
	 */

	int reg_num;
	switch (address & 0x03) {
		case 0:
			d->state.OPNAadr = data;
			break;

		case 1:
			// Trivial optimization for DAC.
			if (d->state.OPNAadr == 0x2A) {
				d->state.DACdata = ((int)data - 0x80) << 7;
				return 0;
			}

			reg_num = d->state.OPNAadr & 0xF0;
			if (reg_num >= 0x30) {
				if (d->state.REG[0][d->state.OPNAadr] == data) {
					// Don't bother doing anything if the
					// register has the same value.
					// TODO: Is this correct?
					return 2;
				}
				d->state.REG[0][d->state.OPNAadr] = data;

				if (reg_num < 0xA0) {
					d->SLOT_SET(d->state.OPNAadr, data);
				} else {
					d->CHANNEL_SET(d->state.OPNAadr, data);
				}
			} else {
				// YM2612 control registers.
				d->state.REG[0][d->state.OPNAadr] = data;

				/* TODO: Reimplement GYM dumping support in LibGens.
				if ((GYM_Dumping) &&
				    ((d->state.OPNAadr == 0x22) ||
				     (d->state.OPNAadr == 0x27) ||
				     (d->state.OPNAadr == 0x28)))
				{
					gym_dump_update(1, (uint8_t)d->state.OPNAadr, data);
				}
				*/

				d->YM_SET(d->state.OPNAadr, data);
			}
			break;

		case 2:
			d->state.OPNBadr = data;
			break;

		case 3:
			reg_num = d->state.OPNBadr & 0xF0;

			if (reg_num >= 0x30) {
				if (d->state.REG[1][d->state.OPNBadr] == data) {
					// Don't bother doing anything if the
					// register has the same value.
					// TODO: Is this correct?
					return 2;
				}
				d->state.REG[1][d->state.OPNBadr] = data;

				/* TODO: Reimplement GYM dumping support in LibGens.
				if (GYM_Dumping)
					gym_dump_update(2, (uint8_t)d->state.OPNBadr, data);
				*/

				if (reg_num < 0xA0) {
					d->SLOT_SET(d->state.OPNBadr + 0x100, data);
				} else {
					d->CHANNEL_SET(d->state.OPNBadr + 0x100, data);
				}
			} else {
				// Invalid register.
				// TODO: Save the value anyway?
				return 1;
			}
			break;
	}

	return 0;
}